

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  long lVar1;
  FieldDescriptor *this;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Reflection *this_00;
  long lVar6;
  Descriptor *pDVar7;
  MapFieldBase *this_01;
  Message *pMVar8;
  int iVar9;
  long lVar10;
  pointer ppFVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  MapIterator local_c0;
  MapIterator local_78;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = GetReflectionOrDie(message);
  lVar6 = (long)*(int *)(CONCAT44(extraout_var,iVar4) + 4);
  if (0 < lVar6) {
    lVar10 = 0;
    do {
      lVar1 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x28);
      if (((*(byte *)(lVar1 + 1 + lVar10) & 0x60) == 0x40) &&
         (bVar3 = Reflection::HasField(this_00,message,(FieldDescriptor *)(lVar1 + lVar10)), !bVar3)
         ) {
        return false;
      }
      lVar10 = lVar10 + 0x48;
    } while (lVar6 * 0x48 != lVar10);
  }
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFieldsOmitStripped(this_00,message,&local_d8);
  ppFVar2 = local_d8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar11 = local_d8.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar11 != ppFVar2;
      ppFVar11 = ppFVar11 + 1) {
    this = *ppFVar11;
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_c0.iter_ = FieldDescriptor::TypeOnceInit;
      local_78.iter_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 (FieldDescriptor **)&local_78);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) != 10)
    goto LAB_003b54f0;
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_c0.iter_ = FieldDescriptor::TypeOnceInit;
      local_78.iter_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 (FieldDescriptor **)&local_78);
    }
    if ((this[2] == (FieldDescriptor)0xb) &&
       (bVar3 = FieldDescriptor::is_map_message_type(this), bVar3)) {
      pDVar7 = FieldDescriptor::message_type(this);
      lVar6 = *(long *)(pDVar7 + 0x28);
      if (*(once_flag **)(lVar6 + 0x60) != (once_flag *)0x0) {
        local_78.iter_ = (void *)(lVar6 + 0x48);
        local_c0.iter_ = FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(lVar6 + 0x60),(_func_void_FieldDescriptor_ptr **)&local_c0,
                   (FieldDescriptor **)&local_78);
      }
      iVar4 = 6;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar6 + 0x4a) * 4) == 10) {
        this_01 = Reflection::GetMapData(this_00,message,this);
        bVar3 = MapFieldBase::IsMapValid(this_01);
        iVar4 = 0;
        if (bVar3) {
          MapIterator::MapIterator(&local_c0,message,this);
          MapIterator::MapIterator(&local_78,message,this);
          (*this_01->_vptr_MapFieldBase[7])(this_01,&local_c0);
          (*this_01->_vptr_MapFieldBase[8])(this_01,&local_78);
          while (iVar4 = (*(local_c0.map_)->_vptr_MapFieldBase[6])
                                   (local_c0.map_,&local_c0,&local_78), (char)iVar4 == '\0') {
            pMVar8 = MapValueConstRef::GetMessageValue(&local_c0.value_.super_MapValueConstRef);
            iVar4 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])(pMVar8);
            if ((char)iVar4 == '\0') {
              iVar4 = 1;
              goto LAB_003b544e;
            }
            (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
          }
          iVar4 = 6;
LAB_003b544e:
          MapIterator::~MapIterator(&local_78);
          MapIterator::~MapIterator(&local_c0);
        }
      }
      if (iVar4 == 0) goto LAB_003b546e;
    }
    else {
LAB_003b546e:
      if ((~(byte)this[1] & 0x60) == 0) {
        iVar4 = Reflection::FieldSize(this_00,message,this);
        bVar3 = 0 < iVar4;
        if (0 < iVar4) {
          iVar9 = 0;
          do {
            pMVar8 = Reflection::GetRepeatedMessage(this_00,message,this,iVar9);
            iVar5 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])(pMVar8);
            if ((char)iVar5 == '\0') {
              iVar4 = 1;
              goto LAB_003b5512;
            }
            iVar9 = iVar9 + 1;
            bVar3 = iVar9 < iVar4;
          } while (iVar9 != iVar4);
        }
        iVar4 = 0;
LAB_003b5512:
        if (!bVar3) {
LAB_003b54f0:
          iVar4 = 0;
        }
      }
      else {
        pMVar8 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
        iVar9 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])(pMVar8);
        iVar4 = 1;
        if ((char)iVar9 != '\0') goto LAB_003b54f0;
      }
    }
    if ((iVar4 != 6) && (iVar4 != 0)) break;
  }
  if (local_d8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppFVar11 == ppFVar2;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  reflection->ListFieldsOmitStripped(message, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}